

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process_unix.cpp
# Opt level: O2

int __thiscall TinyProcessLib::Process::open(Process *this,char *__file,int __oflag,...)

{
  int *piVar1;
  int iVar2;
  __pid_t _Var3;
  pointer __p;
  pointer piVar4;
  long lVar5;
  int fd;
  int stdin_p [2];
  int stdout_p [2];
  int stderr_p [2];
  
  if (this->open_stdin == true) {
    piVar4 = (pointer)operator_new(4);
    stdin_p[0] = 0;
    stdin_p[1] = 0;
    std::__uniq_ptr_impl<int,_std::default_delete<int>_>::reset
              ((__uniq_ptr_impl<int,_std::default_delete<int>_> *)&this->stdin_fd,piVar4);
    std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
              ((unique_ptr<int,_std::default_delete<int>_> *)stdin_p);
  }
  if ((this->read_stdout).super__Function_base._M_manager != (_Manager_type)0x0) {
    piVar4 = (pointer)operator_new(4);
    stdin_p[0] = 0;
    stdin_p[1] = 0;
    std::__uniq_ptr_impl<int,_std::default_delete<int>_>::reset
              ((__uniq_ptr_impl<int,_std::default_delete<int>_> *)&this->stdout_fd,piVar4);
    std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
              ((unique_ptr<int,_std::default_delete<int>_> *)stdin_p);
  }
  if ((this->read_stderr).super__Function_base._M_manager != (_Manager_type)0x0) {
    piVar4 = (pointer)operator_new(4);
    stdin_p[0] = 0;
    stdin_p[1] = 0;
    std::__uniq_ptr_impl<int,_std::default_delete<int>_>::reset
              ((__uniq_ptr_impl<int,_std::default_delete<int>_> *)&this->stderr_fd,piVar4);
    std::unique_ptr<int,_std::default_delete<int>_>::~unique_ptr
              ((unique_ptr<int,_std::default_delete<int>_> *)stdin_p);
  }
  if (((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl != (int *)0x0) && (iVar2 = pipe(stdin_p), iVar2 != 0)) {
    return -1;
  }
  if (((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
       super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>.
       _M_head_impl == (int *)0x0) || (iVar2 = pipe(stdout_p), iVar2 == 0)) {
    if (((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
         super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
         super__Head_base<0UL,_int_*,_false>._M_head_impl == (int *)0x0) ||
       (iVar2 = pipe(stderr_p), iVar2 == 0)) {
      _Var3 = fork();
      if (-1 < _Var3) {
        piVar1 = (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                 super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                 super__Head_base<0UL,_int_*,_false>._M_head_impl;
        if (_Var3 != 0) {
          if (piVar1 != (int *)0x0) {
            close(stdin_p[0]);
          }
          if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
            close(stdout_p[1]);
          }
          if ((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
              super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
              super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
            close(stderr_p[1]);
          }
          piVar1 = (this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
                   super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar1 != (int *)0x0) {
            *piVar1 = stdin_p[1];
          }
          piVar1 = (this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                   .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar1 != (int *)0x0) {
            *piVar1 = stdout_p[0];
          }
          piVar1 = (this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t
                   .super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
                   super__Head_base<0UL,_int_*,_false>._M_head_impl;
          if (piVar1 != (int *)0x0) {
            *piVar1 = stderr_p[0];
          }
          this->closed = false;
          (this->data).id = _Var3;
          return _Var3;
        }
        if (piVar1 != (int *)0x0) {
          dup2(stdin_p[0],0);
        }
        if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          dup2(stdout_p[1],1);
        }
        if ((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          dup2(stderr_p[1],2);
        }
        if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          close(stdin_p[0]);
          close(stdin_p[1]);
        }
        if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          close(stdout_p[0]);
          close(stdout_p[1]);
        }
        if ((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
            super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
          close(stderr_p[0]);
          close(stderr_p[1]);
        }
        if ((this->config).inherit_file_descriptors == false) {
          lVar5 = sysconf(4);
          for (iVar2 = 3; iVar2 < (int)lVar5; iVar2 = iVar2 + 1) {
            close(iVar2);
          }
        }
        setpgid(0,0);
        if (*(long *)(__file + 0x10) != 0) {
          std::function<void_()>::operator()((function<void_()> *)__file);
        }
        _exit(1);
      }
      if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
        close(stdin_p[0]);
        close(stdin_p[1]);
      }
      if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl != (int *)0x0) {
        close(stdout_p[0]);
        close(stdout_p[1]);
      }
      if ((this->stderr_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl == (int *)0x0) {
        return _Var3;
      }
      close(stderr_p[0]);
      close(stderr_p[1]);
      return _Var3;
    }
    if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>
        ._M_head_impl != (int *)0x0) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if ((this->stdout_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>
        ._M_head_impl == (int *)0x0) {
      return -1;
    }
    close(stdout_p[0]);
    piVar1 = stdout_p;
  }
  else {
    if ((this->stdin_fd)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int>_>._M_t.
        super__Tuple_impl<0UL,_int_*,_std::default_delete<int>_>.super__Head_base<0UL,_int_*,_false>
        ._M_head_impl == (int *)0x0) {
      return -1;
    }
    close(stdin_p[0]);
    piVar1 = stdin_p;
  }
  close(piVar1[1]);
  return -1;
}

Assistant:

Process::id_type Process::open(const std::function<void()> &function) noexcept {
  if(open_stdin)
    stdin_fd = std::unique_ptr<fd_type>(new fd_type);
  if(read_stdout)
    stdout_fd = std::unique_ptr<fd_type>(new fd_type);
  if(read_stderr)
    stderr_fd = std::unique_ptr<fd_type>(new fd_type);

  int stdin_p[2], stdout_p[2], stderr_p[2];

  if(stdin_fd && pipe(stdin_p) != 0)
    return -1;
  if(stdout_fd && pipe(stdout_p) != 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    return -1;
  }
  if(stderr_fd && pipe(stderr_p) != 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    return -1;
  }

  id_type pid = fork();

  if(pid < 0) {
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    if(stderr_fd) {
      close(stderr_p[0]);
      close(stderr_p[1]);
    }
    return pid;
  }
  else if(pid == 0) {
    if(stdin_fd)
      dup2(stdin_p[0], 0);
    if(stdout_fd)
      dup2(stdout_p[1], 1);
    if(stderr_fd)
      dup2(stderr_p[1], 2);
    if(stdin_fd) {
      close(stdin_p[0]);
      close(stdin_p[1]);
    }
    if(stdout_fd) {
      close(stdout_p[0]);
      close(stdout_p[1]);
    }
    if(stderr_fd) {
      close(stderr_p[0]);
      close(stderr_p[1]);
    }

    if(!config.inherit_file_descriptors) {
      int fd_max = static_cast<int>(sysconf(_SC_OPEN_MAX)); // truncation is safe
      // Based on http://stackoverflow.com/a/899533/3808293
      // TODO: find a way to optimize, as this is slow on systems with high fd_max
      for(int fd = 3; fd < fd_max; fd++)
        close(fd);
    }

    setpgid(0, 0);
    //TODO: See here on how to emulate tty for colors: http://stackoverflow.com/questions/1401002/trick-an-application-into-thinking-its-stdin-is-interactive-not-a-pipe
    //TODO: One solution is: echo "command;exit"|script -q /dev/null

    if(function)
      function();

    _exit(EXIT_FAILURE);
  }

  if(stdin_fd)
    close(stdin_p[0]);
  if(stdout_fd)
    close(stdout_p[1]);
  if(stderr_fd)
    close(stderr_p[1]);

  if(stdin_fd)
    *stdin_fd = stdin_p[1];
  if(stdout_fd)
    *stdout_fd = stdout_p[0];
  if(stderr_fd)
    *stderr_fd = stderr_p[0];

  closed = false;
  data.id = pid;
  return pid;
}